

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

bool llama_state_save_file
               (llama_context *ctx,char *path_session,llama_token *tokens,size_t n_token_count)

{
  bool bVar1;
  exception *err;
  llama_token *in_stack_00000010;
  char *in_stack_00000018;
  llama_context *in_stack_ffffffffffffffc0;
  
  llama_context::synchronize(in_stack_ffffffffffffffc0);
  bVar1 = llama_context::state_save_file
                    ((llama_context *)n_token_count,in_stack_00000018,in_stack_00000010,(size_t)err)
  ;
  return bVar1;
}

Assistant:

bool llama_state_save_file(llama_context * ctx, const char * path_session, const llama_token * tokens, size_t n_token_count) {
    ctx->synchronize();

    try {
        return ctx->state_save_file(path_session, tokens, n_token_count);
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: error saving session file: %s\n", __func__, err.what());
        return false;
    }
}